

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O2

void Rml::ElementStyle::TransitionPropertyChanges
               (Element *element,PropertyIdSet *properties,PropertyDictionary *inline_properties,
               ElementDefinition *old_definition,ElementDefinition *new_definition)

{
  undefined8 *puVar1;
  Transition *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  Property *pPVar6;
  Transition *transition_1;
  Transition *transition_00;
  PropertyIdSetIterator PVar7;
  PropertyIdSetIterator local_90;
  ElementDefinition *new_definition_local;
  ElementDefinition *old_definition_local;
  Element *element_local;
  anon_class_32_4_efda7985 add_transition;
  Transition transition;
  
  new_definition_local = new_definition;
  old_definition_local = old_definition;
  element_local = element;
  if (element == (Element *)0x0) {
    bVar4 = Assert("RMLUI_ASSERT(element)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementStyle.cpp"
                   ,0x75);
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  if ((new_definition != (ElementDefinition *)0x0 && old_definition != (ElementDefinition *)0x0) &&
     ((properties->defined_ids).super__Base_bitset<2UL>._M_w[1] != 0 ||
      (properties->defined_ids).super__Base_bitset<2UL>._M_w[0] != 0)) {
    pPVar6 = GetLocalProperty(Transition,inline_properties,new_definition);
    if ((pPVar6 != (Property *)0x0) &&
       (((pPVar6->value).type == TRANSITIONLIST && ((pPVar6->value).data[0] == '\0')))) {
      if (TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
          ::empty_properties == '\0') {
        iVar5 = __cxa_guard_acquire(&TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
                                     ::empty_properties);
        if (iVar5 != 0) {
          PropertyDictionary::PropertyDictionary(&TransitionPropertyChanges::empty_properties);
          __cxa_atexit(PropertyDictionary::~PropertyDictionary,
                       &TransitionPropertyChanges::empty_properties,&__dso_handle);
          __cxa_guard_release(&TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
                               ::empty_properties);
        }
      }
      add_transition.element = &element_local;
      add_transition.old_definition = &old_definition_local;
      add_transition.new_definition = &new_definition_local;
      add_transition.inline_properties = inline_properties;
      if ((pPVar6->value).data[1] == '\x01') {
        puVar1 = *(undefined8 **)((pPVar6->value).data + 8);
        transition._32_8_ = puVar1[4];
        transition._0_8_ = *puVar1;
        transition.tween._0_8_ = puVar1[1];
        transition.tween.callback = (CallbackFnc)puVar1[2];
        transition._24_8_ = puVar1[3];
        local_90 = PropertyIdSet::begin(properties);
        while( true ) {
          PVar7 = PropertyIdSet::end(properties);
          if (PVar7 == local_90) break;
          transition.id = (PropertyId)local_90.id_index;
          bVar4 = TransitionPropertyChanges::anon_class_32_4_efda7985::operator()
                            (&add_transition,&transition);
          if (bVar4) {
            local_90 = PropertyIdSet::Erase(properties,local_90);
          }
          else {
            PropertyIdSetIterator::operator++(&local_90);
          }
        }
      }
      else {
        pTVar2 = *(Transition **)((pPVar6->value).data + 0x10);
        for (transition_00 = *(Transition **)((pPVar6->value).data + 8); transition_00 != pTVar2;
            transition_00 = transition_00 + 1) {
          bVar4 = PropertyIdSet::Contains(properties,transition_00->id);
          if (bVar4) {
            bVar4 = TransitionPropertyChanges::anon_class_32_4_efda7985::operator()
                              (&add_transition,transition_00);
            if (bVar4) {
              PropertyIdSet::Erase(properties,transition_00->id);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ElementStyle::TransitionPropertyChanges(Element* element, PropertyIdSet& properties, const PropertyDictionary& inline_properties,
	const ElementDefinition* old_definition, const ElementDefinition* new_definition)
{
	// Apply transition to relevant properties if a transition is defined on element.
	// Properties that are part of a transition are removed from the properties list.

	RMLUI_ASSERT(element);
	if (!old_definition || !new_definition || properties.Empty())
		return;

	// We get the local property instead of the computed value here, because we want to intercept property changes even before the computed values are
	// ready. Now that we have the concept of computed values, we may want do this operation directly on them instead.
	if (const Property* transition_property = GetLocalProperty(PropertyId::Transition, inline_properties, new_definition))
	{
		if (transition_property->value.GetType() != Variant::TRANSITIONLIST)
			return;

		const TransitionList& transition_list = transition_property->value.GetReference<TransitionList>();

		if (!transition_list.none)
		{
			static const PropertyDictionary empty_properties;

			auto add_transition = [&](const Transition& transition) {
				bool transition_added = false;
				const Property* start_value = GetProperty(transition.id, element, inline_properties, old_definition);
				const Property* target_value = GetProperty(transition.id, element, empty_properties, new_definition);
				if (start_value && target_value && (*start_value != *target_value))
					transition_added = element->StartTransition(transition, *start_value, *target_value);
				return transition_added;
			};

			if (transition_list.all)
			{
				Transition transition = transition_list.transitions[0];
				for (auto it = properties.begin(); it != properties.end();)
				{
					transition.id = *it;
					if (add_transition(transition))
						it = properties.Erase(it);
					else
						++it;
				}
			}
			else
			{
				for (const Transition& transition : transition_list.transitions)
				{
					if (properties.Contains(transition.id))
					{
						if (add_transition(transition))
							properties.Erase(transition.id);
					}
				}
			}
		}
	}
}